

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Color * LoadImagePalette(Image image,int maxPaletteSize,int *colorsCount)

{
  Color *pCVar1;
  Image image_00;
  undefined1 auVar2 [16];
  bool bVar3;
  Color *colors;
  Image *pIVar4;
  int local_44;
  int j;
  _Bool colorInPalette;
  int i_1;
  int i;
  Color *pixels;
  Color *palette;
  int palCount;
  int *colorsCount_local;
  int maxPaletteSize_local;
  
  pIVar4 = &image;
  palette._4_4_ = 0;
  pixels = (Color *)0x0;
  auVar2 = image._8_16_;
  image_00._16_8_ = pIVar4;
  image_00.data = (void *)auVar2._0_8_;
  image_00.width = auVar2._8_4_;
  image_00.height = auVar2._12_4_;
  colors = LoadImageColors(image_00);
  if (colors != (Color *)0x0) {
    pixels = (Color *)malloc((long)maxPaletteSize << 2);
    for (i_1 = 0; i_1 < maxPaletteSize; i_1 = i_1 + 1) {
      pCVar1 = pixels + i_1;
      pCVar1->r = '\0';
      pCVar1->g = '\0';
      pCVar1->b = '\0';
      pCVar1->a = '\0';
    }
    for (j = 0; j < pIVar4->width * pIVar4->height; j = j + 1) {
      if (colors[j].a != '\0') {
        bVar3 = false;
        for (local_44 = 0; local_44 < maxPaletteSize; local_44 = local_44 + 1) {
          if ((((colors[j].r == pixels[local_44].r) && (colors[j].g == pixels[local_44].g)) &&
              (colors[j].b == pixels[local_44].b)) && (colors[j].a == pixels[local_44].a)) {
            bVar3 = true;
            break;
          }
        }
        if (!bVar3) {
          pixels[palette._4_4_] = colors[j];
          palette._4_4_ = palette._4_4_ + 1;
          if (maxPaletteSize <= palette._4_4_) {
            j = pIVar4->width * pIVar4->height;
            TraceLog(4,"IMAGE: Palette is greater than %i colors",(ulong)(uint)maxPaletteSize);
          }
        }
      }
    }
    UnloadImageColors(colors);
  }
  *colorsCount = palette._4_4_;
  return pixels;
}

Assistant:

Color *LoadImagePalette(Image image, int maxPaletteSize, int *colorsCount)
{
    #define COLOR_EQUAL(col1, col2) ((col1.r == col2.r)&&(col1.g == col2.g)&&(col1.b == col2.b)&&(col1.a == col2.a))

    int palCount = 0;
    Color *palette = NULL;
    Color *pixels = LoadImageColors(image);

    if (pixels != NULL)
    {
        palette = (Color *)RL_MALLOC(maxPaletteSize*sizeof(Color));

        for (int i = 0; i < maxPaletteSize; i++) palette[i] = BLANK;   // Set all colors to BLANK

        for (int i = 0; i < image.width*image.height; i++)
        {
            if (pixels[i].a > 0)
            {
                bool colorInPalette = false;

                // Check if the color is already on palette
                for (int j = 0; j < maxPaletteSize; j++)
                {
                    if (COLOR_EQUAL(pixels[i], palette[j]))
                    {
                        colorInPalette = true;
                        break;
                    }
                }

                // Store color if not on the palette
                if (!colorInPalette)
                {
                    palette[palCount] = pixels[i];      // Add pixels[i] to palette
                    palCount++;

                    // We reached the limit of colors supported by palette
                    if (palCount >= maxPaletteSize)
                    {
                        i = image.width*image.height;   // Finish palette get
                        TRACELOG(LOG_WARNING, "IMAGE: Palette is greater than %i colors", maxPaletteSize);
                    }
                }
            }
        }

        UnloadImageColors(pixels);
    }

    *colorsCount = palCount;

    return palette;
}